

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

RecGroup __thiscall wasm::anon_unknown_0::RecGroupStore::insert(RecGroupStore *this,RecGroup group)

{
  ulong *puVar1;
  Kind KVar2;
  pointer pFVar3;
  long *plVar4;
  _Hash_node_base *p_Var5;
  undefined8 *puVar6;
  ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator> PVar7;
  ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator> PVar8;
  bool bVar9;
  HeapTypeInfo *pHVar10;
  size_t sVar11;
  size_t sVar12;
  difference_type dVar13;
  difference_type dVar14;
  HeapTypeInfo *pHVar15;
  __hashtable_alloc *p_Var16;
  pointer __s;
  _Hash_node_base *p_Var17;
  ulong uVar18;
  size_type __n;
  HeapType HVar19;
  HeapType HVar20;
  ulong uVar21;
  _Hash_node_base *p_Var22;
  size_t sVar23;
  long *plVar24;
  long *plVar25;
  Field *field;
  ulong uVar26;
  pointer pFVar27;
  pointer b;
  long lVar28;
  ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator> PVar29;
  Iterator IVar30;
  undefined1 auVar31 [16];
  allocator_type local_41;
  undefined1 auStack_40 [7];
  __buckets_alloc_type __alloc;
  _Scoped_node __node;
  
  if (((ulong)this & 1) == 0) {
    uVar26 = *(long *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) -
             (this->mutex).super___mutex_base._M_mutex.__align >> 3;
  }
  else {
    uVar26 = 1;
  }
  _auStack_40 = (RecGroup)(RecGroup)this;
  PVar29 = (ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator>)
           RecGroup::end((RecGroup *)auStack_40);
  for (sVar23 = 0; PVar7.index = sVar23, PVar7.parent = (RecGroup *)auStack_40, PVar29 != PVar7;
      sVar23 = sVar23 + 1) {
    if (((ulong)_auStack_40 & 1) == 0) {
      HVar19.id = *(uintptr_t *)(*(long *)_auStack_40 + sVar23 * 8);
    }
    else {
      HVar19.id = (ulong)_auStack_40 & 0xfffffffffffffffe;
    }
    if (HVar19.id < 0xe) {
      uVar21 = HVar19.id + 0x9e3779b97f4a8c15;
    }
    else {
      pHVar10 = getHeapTypeInfo(HVar19);
      if (pHVar10->isFinalized == false) {
        __assert_fail("info.isFinalized",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                      ,0x84b,
                      "size_t wasm::(anonymous namespace)::RecGroupHasher::hash(const HeapTypeInfo &) const"
                     );
      }
      HVar20.id = (uintptr_t)pHVar10->supertype;
      uVar21 = (ulong)(HVar20.id != 0);
      if (HVar20.id != 0) {
        sVar11 = RecGroupHasher::hash((RecGroupHasher *)auStack_40,HVar20);
        uVar21 = uVar21 ^ sVar11 + 0x9e3779b97f4a8c15;
      }
      KVar2 = pHVar10->kind;
      switch((ulong)KVar2) {
      case 0:
        handle_unreachable("Basic HeapTypeInfo should have been canonicalized",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                           ,0x853);
      case 1:
        sVar11 = RecGroupHasher::hash
                           ((RecGroupHasher *)auStack_40,
                            (Type)(pHVar10->field_6).signature.params.id);
        sVar12 = RecGroupHasher::hash
                           ((RecGroupHasher *)auStack_40,
                            (Type)(pHVar10->field_6).signature.results.id);
        sVar11 = (sVar11 >> 4) + sVar12 + sVar11 * 0x1000 + -0x61c8864680b583eb ^ sVar11;
        break;
      case 2:
        pFVar27 = (pHVar10->field_6).struct_.fields.
                  super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pFVar3 = (pHVar10->field_6).struct_.fields.
                 super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        sVar11 = (long)pFVar3 - (long)pFVar27 >> 4;
        for (; pFVar27 != pFVar3; pFVar27 = pFVar27 + 1) {
          sVar12 = RecGroupHasher::hash((RecGroupHasher *)auStack_40,pFVar27);
          sVar11 = sVar11 ^ sVar11 * 0x1000 + -0x61c8864680b583eb + (sVar11 >> 4) + sVar12;
        }
        break;
      case 3:
        sVar11 = RecGroupHasher::hash
                           ((RecGroupHasher *)auStack_40,(Field *)&(pHVar10->field_6).signature);
        break;
      default:
        handle_unreachable("unexpected kind",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                           ,0x85e);
      }
      uVar21 = (uVar21 >> 4) + uVar21 * 0x1000 + -0x61c8864680b583eb + (ulong)KVar2 ^ uVar21;
      uVar21 = (uVar21 * 0x1000 + -0x61c8864680b583eb + (uVar21 >> 4) + sVar11 ^ uVar21) +
               0x9e3779b97f4a7c15;
    }
    uVar26 = uVar26 ^ uVar26 * 0x1000 + -0x61c8864680b583eb + (uVar26 >> 4) +
                      (HVar19.id < 0xe ^ uVar21);
  }
  uVar21 = uVar26 % (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_;
  plVar25 = *(long **)(wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ + uVar21 * 8);
  if (plVar25 != (long *)0x0) {
    uVar18 = ((long *)*plVar25)[2];
    plVar4 = (long *)*plVar25;
    do {
      plVar24 = plVar4;
      if (uVar18 == uVar26) {
        __node._M_h = (__hashtable_alloc *)plVar24[1];
        _auStack_40 = (RecGroup)(RecGroup)this;
        if ((RecGroupStore *)__node._M_h == this) {
LAB_00a39970:
          if (*plVar25 != 0) {
            return (RecGroup)*(uintptr_t *)(*plVar25 + 8);
          }
          break;
        }
        PVar29 = (ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator>)
                 RecGroup::end((RecGroup *)auStack_40);
        IVar30 = RecGroup::end((RecGroup *)&__node);
        dVar13 = std::__distance<wasm::RecGroup::Iterator>(auStack_40,0,PVar29.parent,PVar29.index);
        dVar14 = std::__distance<wasm::RecGroup::Iterator>
                           (&__node,0,
                            IVar30.
                            super_ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator>
                            .parent,IVar30.
                                    super_ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator>
                                    .index);
        if (dVar13 == dVar14) {
          sVar23 = 0;
          do {
            PVar8.index = sVar23;
            PVar8.parent = (RecGroup *)auStack_40;
            if (PVar29 == PVar8) goto LAB_00a39970;
            if (((ulong)_auStack_40 & 1) == 0) {
              HVar19.id = *(uintptr_t *)(*(long *)_auStack_40 + sVar23 * 8);
            }
            else {
              HVar19.id = (ulong)_auStack_40 & 0xfffffffffffffffe;
            }
            if (((ulong)__node._M_h & 1) == 0) {
              HVar20.id = *(uintptr_t *)(*(long *)__node._M_h + sVar23 * 8);
            }
            else {
              HVar20.id = (ulong)__node._M_h & 0xfffffffffffffffe;
            }
            if (HVar19.id != HVar20.id) {
              if ((HVar19.id < 0xe) || (HVar20.id < 0xe)) break;
              pHVar10 = getHeapTypeInfo(HVar19);
              pHVar15 = getHeapTypeInfo(HVar20);
              HVar19.id = (uintptr_t)pHVar10->supertype;
              if (((HVar19.id != 0) == (pHVar15->supertype == (HeapTypeInfo *)0x0)) ||
                 (((HVar19.id != 0 &&
                   (bVar9 = RecGroupEquator::eq((RecGroupEquator *)auStack_40,HVar19,
                                                (HeapType)pHVar15->supertype), !bVar9)) ||
                  (pHVar10->kind != pHVar15->kind)))) break;
              switch(pHVar10->kind) {
              case BasicKind:
                handle_unreachable("Basic HeapTypeInfo should have been canonicalized",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                                   ,0x8d1);
              case SignatureKind:
                bVar9 = RecGroupEquator::eq((RecGroupEquator *)auStack_40,
                                            (Type)(pHVar10->field_6).signature.params.id,
                                            (Type)(pHVar15->field_6).signature.params.id);
                if (!bVar9) goto LAB_00a3993f;
                bVar9 = RecGroupEquator::eq((RecGroupEquator *)auStack_40,
                                            (Type)(pHVar10->field_6).signature.results.id,
                                            (Type)(pHVar15->field_6).signature.results.id);
                break;
              case StructKind:
                pFVar27 = (pHVar10->field_6).struct_.fields.
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pFVar3 = (pHVar10->field_6).struct_.fields.
                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                b = (pHVar15->field_6).struct_.fields.
                    super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                    super__Vector_impl_data._M_start;
                if ((long)pFVar3 - (long)pFVar27 ==
                    (long)(pHVar15->field_6).struct_.fields.
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)b) {
                  for (; pFVar27 != pFVar3; pFVar27 = pFVar27 + 1) {
                    bVar9 = RecGroupEquator::eq((RecGroupEquator *)auStack_40,pFVar27,b);
                    if (!bVar9) goto LAB_00a3993f;
                    b = b + 1;
                  }
                  goto LAB_00a3992b;
                }
                goto LAB_00a3993f;
              case ArrayKind:
                bVar9 = RecGroupEquator::eq((RecGroupEquator *)auStack_40,
                                            (Field *)&(pHVar10->field_6).signature,
                                            (Field *)&(pHVar15->field_6).signature);
                break;
              default:
                handle_unreachable("unexpected kind",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                                   ,0x8d9);
              }
              if (bVar9 == false) break;
            }
LAB_00a3992b:
            sVar23 = sVar23 + 1;
          } while( true );
        }
      }
LAB_00a3993f:
      plVar4 = (long *)*plVar24;
      if ((plVar4 == (long *)0x0) ||
         (uVar18 = plVar4[2], plVar25 = plVar24,
         uVar18 % (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_ != uVar21)) break;
    } while( true );
  }
  p_Var16 = (__hashtable_alloc *)operator_new(0x18);
  *(undefined8 *)p_Var16 = 0;
  *(RecGroupStore **)(p_Var16 + 8) = this;
  _auStack_40 = (RecGroup)0xe640b8;
  __node._M_h = p_Var16;
  auVar31 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                      (0xe640d8,wasm::(anonymous_namespace)::globalRecGroupStore._48_8_,
                       wasm::(anonymous_namespace)::globalRecGroupStore._64_8_);
  __n = auVar31._8_8_;
  if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (__n == 1) {
      wasm::(anonymous_namespace)::globalRecGroupStore._88_8_ = 0;
      __s = (pointer)(wasm::(anonymous_namespace)::globalRecGroupStore + 0x58);
    }
    else {
      __s = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::allocate
                      (&local_41,__n);
      memset(__s,0,__n * 8);
    }
    p_Var5 = (_Hash_node_base *)wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
    wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = 0;
    uVar21 = 0;
LAB_00a39a19:
    p_Var22 = p_Var5;
    uVar18 = uVar21;
    if (p_Var22 != (_Hash_node_base *)0x0) {
      p_Var5 = p_Var22->_M_nxt;
      uVar21 = (ulong)p_Var22[2]._M_nxt % __n;
      if (__s[uVar21] == (_Hash_node_base *)0x0) goto LAB_00a39a48;
      p_Var22->_M_nxt = __s[uVar21]->_M_nxt;
      p_Var17 = __s[uVar21];
      uVar21 = uVar18;
      goto LAB_00a39a67;
    }
    std::
    _Hashtable<wasm::(anonymous_namespace)::RecGroupStructure,_wasm::(anonymous_namespace)::RecGroupStructure,_std::allocator<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Identity,_std::equal_to<wasm::(anonymous_namespace)::RecGroupStructure>,_std::hash<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::_M_deallocate_buckets
              ((_Hashtable<wasm::(anonymous_namespace)::RecGroupStructure,_wasm::(anonymous_namespace)::RecGroupStructure,_std::allocator<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Identity,_std::equal_to<wasm::(anonymous_namespace)::RecGroupStructure>,_std::hash<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)(wasm::(anonymous_namespace)::globalRecGroupStore + 0x28));
    uVar21 = uVar26 % __n;
    wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ = __s;
    wasm::(anonymous_namespace)::globalRecGroupStore._48_8_ = __n;
  }
  lVar28 = wasm::(anonymous_namespace)::globalRecGroupStore._40_8_;
  *(ulong *)(p_Var16 + 0x10) = uVar26;
  puVar6 = *(undefined8 **)(lVar28 + uVar21 * 8);
  if (puVar6 == (undefined8 *)0x0) {
    *(undefined8 *)p_Var16 = wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
    if (wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ != 0) {
      puVar1 = (ulong *)(wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ + 0x10);
      wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = p_Var16;
      *(__hashtable_alloc **)
       (lVar28 + (*puVar1 % (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_) * 8) =
           p_Var16;
      lVar28 = wasm::(anonymous_namespace)::globalRecGroupStore._40_8_;
      p_Var16 = (__hashtable_alloc *)wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
    }
    wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = p_Var16;
    *(undefined8 *)(lVar28 + uVar21 * 8) = 0xe640c8;
  }
  else {
    *(undefined8 *)p_Var16 = *puVar6;
    **(undefined8 **)(lVar28 + uVar21 * 8) = p_Var16;
  }
  wasm::(anonymous_namespace)::globalRecGroupStore._64_8_ =
       wasm::(anonymous_namespace)::globalRecGroupStore._64_8_ + 1;
  __node._M_h = (__hashtable_alloc *)0x0;
  std::
  _Hashtable<wasm::(anonymous_namespace)::RecGroupStructure,_wasm::(anonymous_namespace)::RecGroupStructure,_std::allocator<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Identity,_std::equal_to<wasm::(anonymous_namespace)::RecGroupStructure>,_std::hash<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Scoped_node::~_Scoped_node((_Scoped_node *)auStack_40);
  return (RecGroup)(uintptr_t)this;
LAB_00a39a48:
  p_Var22->_M_nxt = (_Hash_node_base *)wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
  wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = p_Var22;
  __s[uVar21] = (_Hash_node_base *)(wasm::(anonymous_namespace)::globalRecGroupStore + 0x38);
  if (p_Var22->_M_nxt != (_Hash_node_base *)0x0) {
    p_Var17 = (_Hash_node_base *)(__s + uVar18);
LAB_00a39a67:
    p_Var17->_M_nxt = p_Var22;
  }
  goto LAB_00a39a19;
}

Assistant:

RecGroup insert(RecGroup group) {
    RecGroupStructure structure{group};
    auto [it, inserted] = canonicalGroups.insert(structure);
    if (inserted) {
      return group;
    } else {
      return it->group;
    }
  }